

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputFile1.unit.cpp
# Opt level: O0

void __thiscall TestFile1_TestParseFile_Test::TestBody(TestFile1_TestParseFile_Test *this)

{
  double dVar1;
  initializer_list<OpticsParser::WLData> __l;
  bool bVar2;
  double *pdVar3;
  char *pcVar4;
  int *rhs;
  variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>
  *__v;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  MeasurementComponent *pMVar8;
  AssertHelper local_e48;
  Message local_e40;
  undefined1 local_e38 [8];
  AssertionResult gtest_ar_13;
  Message local_e20;
  undefined1 local_e18 [8];
  AssertionResult gtest_ar_12;
  Message local_e00;
  undefined1 local_df8 [8];
  AssertionResult gtest_ar_11;
  Message local_de0;
  undefined1 local_dd8 [8];
  AssertionResult gtest_ar_10;
  uint i;
  Message local_db8;
  size_type local_db0;
  size_type local_da8;
  undefined1 local_da0 [8];
  AssertionResult gtest_ar_9;
  vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *givenResults;
  WLData local_d80;
  WLData local_d10;
  WLData local_ca0;
  WLData local_c30;
  WLData local_bc0;
  WLData local_b50;
  iterator local_ae0;
  size_type local_ad8;
  undefined1 local_ad0 [8];
  vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> correctResults;
  Message local_ab0;
  undefined1 local_aa8 [8];
  AssertionResult gtest_ar_8;
  Message local_a90;
  undefined1 local_a88 [8];
  AssertionResult gtest_ar_7;
  Message local_a70;
  undefined1 local_a68 [8];
  AssertionResult gtest_ar_6;
  Message local_a50;
  int local_a44;
  undefined1 local_a40 [8];
  AssertionResult gtest_ar_5;
  Message local_a28;
  undefined1 local_a20 [8];
  AssertionResult gtest_ar_4;
  Message local_a08;
  undefined1 local_a00 [8];
  AssertionResult gtest_ar_3;
  Message local_9e8;
  undefined1 local_9e0 [8];
  AssertionResult gtest_ar_2;
  Message local_9c8;
  undefined1 local_9c0 [8];
  AssertionResult gtest_ar_1;
  Message local_9a8;
  undefined1 local_9a0 [8];
  AssertionResult gtest_ar;
  ProductData productData;
  Parser parser;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string inputFile;
  TestFile1_TestParseFile_Test *this_local;
  
  inputFile.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"InputFile1.dat",&local_31);
  std::allocator<char>::~allocator(&local_31);
  OpticsParser::Parser::parseFile
            ((ProductData *)&gtest_ar.message_,
             (Parser *)
             &productData.deviceType.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0x23,(string *)local_30);
  pdVar3 = std::optional<double>::value((optional<double> *)&productData.cgdbShadeMaterialId);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_9a0,"3.048","productData.thickness.value()","1e-6",3.048,*pdVar3,
             1e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a0);
  if (!bVar2) {
    testing::Message::Message(&local_9a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_9a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
               ,0x5d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_9a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_9a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a0);
  pdVar3 = std::optional<double>::value
                     ((optional<double> *)
                      &productData.thickness.super__Optional_base<double,_true,_true>._M_payload.
                       super__Optional_payload_base<double>._M_engaged);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_9c0,"1","productData.conductivity.value()","1e-6",1.0,*pdVar3,1e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c0);
  if (!bVar2) {
    testing::Message::Message(&local_9c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_9c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
               ,0x5e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_9c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_9c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c0);
  pdVar3 = std::optional<double>::value
                     ((optional<double> *)
                      &productData.conductivity.super__Optional_base<double,_true,_true>._M_payload.
                       super__Optional_payload_base<double>._M_engaged);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_9e0,"0","productData.IRTransmittance.value()","1e-6",0.0,*pdVar3,
             1e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e0);
  if (!bVar2) {
    testing::Message::Message(&local_9e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_9e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
               ,0x5f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_9e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_9e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e0);
  pdVar3 = std::optional<double>::value
                     ((optional<double> *)
                      &productData.IRTransmittance.super__Optional_base<double,_true,_true>.
                       _M_payload.super__Optional_payload_base<double>._M_engaged);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_a00,"0.84","productData.frontEmissivity.value()","1e-6",0.84,*pdVar3,
             1e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a00);
  if (!bVar2) {
    testing::Message::Message(&local_a08);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
               ,0x60,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_a08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_a08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a00);
  pdVar3 = std::optional<double>::value
                     ((optional<double> *)
                      &productData.frontEmissivity.super__Optional_base<double,_true,_true>.
                       _M_payload.super__Optional_payload_base<double>._M_engaged);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_a20,"0.84","productData.backEmissivity.value()","1e-6",0.84,*pdVar3,
             1e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a20);
  if (!bVar2) {
    testing::Message::Message(&local_a28);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
               ,0x61,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_a28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_a28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a20);
  local_a44 = 0x66;
  rhs = std::optional<int>::value
                  ((optional<int> *)
                   &productData.productSubtype.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_engaged);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a40,"102","productData.nfrcid.value()",&local_a44,rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a40);
  if (!bVar2) {
    testing::Message::Message(&local_a50);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
               ,0x62,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_a50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_a50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a40);
  testing::internal::EqHelper::
  Compare<char[20],_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nullptr>
            ((EqHelper *)local_a68,"\"Generic Clear Glass\"","productData.productName",
             (char (*) [20])"Generic Clear Glass",
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&productData.name.field_2 + 8));
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a68);
  if (!bVar2) {
    testing::Message::Message(&local_a70);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
               ,99,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_a70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_a70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a68);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_a88,"\"glazing\"","productData.productType",(char (*) [8])"glazing",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &productData.productName.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a88);
  if (!bVar2) {
    testing::Message::Message(&local_a90);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
               ,100,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_a90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_a90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a88);
  testing::internal::EqHelper::
  Compare<char[11],_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nullptr>
            ((EqHelper *)local_aa8,"\"Monolithic\"","productData.productSubtype",
             (char (*) [11])"Monolithic",
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&productData.manufacturer.field_2 + 8));
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_aa8);
  if (!bVar2) {
    testing::Message::Message(&local_ab0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_aa8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &correctResults.
                super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
               ,0x65,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &correctResults.
                super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_ab0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &correctResults.
                super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_ab0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_aa8);
  OpticsParser::WLData::WLData(&local_d80,0.3,0.002,0.047,0.048);
  OpticsParser::WLData::WLData(&local_d10,0.305,0.003,0.047,0.048);
  OpticsParser::WLData::WLData(&local_ca0,0.31,0.009,0.047,0.048);
  OpticsParser::WLData::WLData(&local_c30,0.315,0.035,0.047,0.048);
  OpticsParser::WLData::WLData(&local_bc0,0.32,0.1,0.047,0.048);
  OpticsParser::WLData::WLData(&local_b50,0.325,0.218,0.049,0.05);
  local_ae0 = &local_d80;
  local_ad8 = 6;
  std::allocator<OpticsParser::WLData>::allocator
            ((allocator<OpticsParser::WLData> *)((long)&givenResults + 7));
  __l._M_len = local_ad8;
  __l._M_array = local_ae0;
  std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::vector
            ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)local_ad0,__l,
             (allocator<OpticsParser::WLData> *)((long)&givenResults + 7));
  std::allocator<OpticsParser::WLData>::~allocator
            ((allocator<OpticsParser::WLData> *)((long)&givenResults + 7));
  __v = std::
        optional<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
        ::value((optional<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
                 *)&productData.wavelengthUnit.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_engaged);
  gtest_ar_9.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::
         get<std::vector<OpticsParser::WLData,std::allocator<OpticsParser::WLData>>,std::vector<OpticsParser::WLData,std::allocator<OpticsParser::WLData>>,OpticsParser::DualBandBSDF>
                   (__v);
  local_da8 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::size
                        ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                         local_ad0);
  local_db0 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::size
                        ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                         gtest_ar_9.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_da0,"correctResults.size()","givenResults.size()",&local_da8,
             &local_db0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_da0);
  if (!bVar2) {
    testing::Message::Message(&local_db8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_da0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffff240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
               ,0x6f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffff240,&local_db8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff240);
    testing::Message::~Message(&local_db8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_da0);
  for (gtest_ar_10.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ = 0;
      uVar5 = (ulong)gtest_ar_10.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_,
      sVar6 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::size
                        ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                         local_ad0), uVar5 < sVar6;
      gtest_ar_10.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ =
           gtest_ar_10.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ + 1) {
    pvVar7 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                       ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                        local_ad0,
                        (ulong)gtest_ar_10.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_);
    dVar1 = pvVar7->wavelength;
    pvVar7 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                       ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                        gtest_ar_9.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl,
                        (ulong)gtest_ar_10.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_);
    testing::internal::DoubleNearPredFormat
              ((internal *)local_dd8,"correctResults[i].wavelength","givenResults[i].wavelength",
               "1e-6",dVar1,pvVar7->wavelength,1e-06);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd8);
    if (!bVar2) {
      testing::Message::Message(&local_de0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_dd8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
                 ,0x72,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_de0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
      testing::Message::~Message(&local_de0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd8);
    pvVar7 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                       ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                        local_ad0,
                        (ulong)gtest_ar_10.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_);
    pMVar8 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar7->directComponent);
    dVar1 = pMVar8->tf;
    pvVar7 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                       ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                        gtest_ar_9.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl,
                        (ulong)gtest_ar_10.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_);
    pMVar8 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar7->directComponent);
    testing::internal::DoubleNearPredFormat
              ((internal *)local_df8,"correctResults[i].directComponent.value().tf",
               "givenResults[i].directComponent.value().tf","1e-6",dVar1,pMVar8->tf,1e-06);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_df8);
    if (!bVar2) {
      testing::Message::Message(&local_e00);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_df8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
                 ,0x75,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_e00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
      testing::Message::~Message(&local_e00);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_df8);
    pvVar7 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                       ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                        local_ad0,
                        (ulong)gtest_ar_10.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_);
    pMVar8 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar7->directComponent);
    dVar1 = pMVar8->rf;
    pvVar7 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                       ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                        gtest_ar_9.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl,
                        (ulong)gtest_ar_10.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_);
    pMVar8 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar7->directComponent);
    testing::internal::DoubleNearPredFormat
              ((internal *)local_e18,"correctResults[i].directComponent.value().rf",
               "givenResults[i].directComponent.value().rf","1e-6",dVar1,pMVar8->rf,1e-06);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e18);
    if (!bVar2) {
      testing::Message::Message(&local_e20);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e18);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
                 ,0x78,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_e20);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
      testing::Message::~Message(&local_e20);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e18);
    pvVar7 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                       ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                        local_ad0,
                        (ulong)gtest_ar_10.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_);
    pMVar8 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar7->directComponent);
    dVar1 = pMVar8->rb;
    pvVar7 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                       ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                        gtest_ar_9.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl,
                        (ulong)gtest_ar_10.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_);
    pMVar8 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar7->directComponent);
    testing::internal::DoubleNearPredFormat
              ((internal *)local_e38,"correctResults[i].directComponent.value().rb",
               "givenResults[i].directComponent.value().rb","1e-6",dVar1,pMVar8->rb,1e-06);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e38);
    if (!bVar2) {
      testing::Message::Message(&local_e40);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e38);
      testing::internal::AssertHelper::AssertHelper
                (&local_e48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/InputFile1.unit.cpp"
                 ,0x7b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_e48,&local_e40);
      testing::internal::AssertHelper::~AssertHelper(&local_e48);
      testing::Message::~Message(&local_e40);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e38);
  }
  std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::~vector
            ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)local_ad0);
  OpticsParser::ProductData::~ProductData((ProductData *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(TestFile1, TestParseFile)
{
	const std::string inputFile = R"(InputFile1.dat)";
	OpticsParser::Parser parser;
	auto productData = parser.parseFile(inputFile);

	EXPECT_NEAR(3.048, productData.thickness.value(), 1e-6);
	EXPECT_NEAR(1, productData.conductivity.value(), 1e-6);
	EXPECT_NEAR(0, productData.IRTransmittance.value(), 1e-6);
	EXPECT_NEAR(0.84, productData.frontEmissivity.value(), 1e-6);
	EXPECT_NEAR(0.84, productData.backEmissivity.value(), 1e-6);
	EXPECT_EQ(102, productData.nfrcid.value());
	EXPECT_EQ("Generic Clear Glass", productData.productName);
	EXPECT_EQ("glazing", productData.productType);
	EXPECT_EQ("Monolithic", productData.productSubtype);
	std::vector<OpticsParser::WLData> correctResults{{0.300, 0.0020, 0.0470, 0.0480},
													 {0.305, 0.0030, 0.0470, 0.0480},
													 {0.310, 0.0090, 0.0470, 0.0480},
													 {0.315, 0.0350, 0.0470, 0.0480},
													 {0.320, 0.1000, 0.0470, 0.0480},
													 {0.325, 0.2180, 0.0490, 0.0500}};

	auto & givenResults =
		std::get<std::vector<OpticsParser::WLData>>(productData.measurements.value());
	EXPECT_EQ(correctResults.size(), givenResults.size());
	for(auto i = 0u; i < correctResults.size(); ++i)
	{
		EXPECT_NEAR(correctResults[i].wavelength, givenResults[i].wavelength, 1e-6);
		EXPECT_NEAR(correctResults[i].directComponent.value().tf,
			givenResults[i].directComponent.value().tf,
			1e-6);
		EXPECT_NEAR(correctResults[i].directComponent.value().rf,
			givenResults[i].directComponent.value().rf,
			1e-6);
		EXPECT_NEAR(correctResults[i].directComponent.value().rb,
			givenResults[i].directComponent.value().rb,
			1e-6);
	}
}